

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

UBool __thiscall
icu_63::RuleBasedBreakIterator::operator==(RuleBasedBreakIterator *this,BreakIterator *that)

{
  bool bVar1;
  UBool UVar2;
  RuleBasedBreakIterator *that2;
  BreakIterator *that_local;
  RuleBasedBreakIterator *this_local;
  
  if (this == (RuleBasedBreakIterator *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator!=
                    ((type_info *)(this->super_BreakIterator).super_UObject._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if (bVar1) {
    return '\0';
  }
  if (this == (RuleBasedBreakIterator *)that) {
    return '\x01';
  }
  UVar2 = utext_equals_63(&this->fText,(UText *)(that + 1));
  if (UVar2 != '\0') {
    if (((this->fPosition == *(int *)(that[1].actualLocale + 0x90)) &&
        (this->fRuleStatusIndex == *(int *)(that[1].actualLocale + 0x94))) &&
       (this->fDone == that[1].validLocale[0x8b])) {
      if ((*(RBBIDataWrapper **)(that[1].actualLocale + 0x88) == this->fData) ||
         (((this->fData != (RBBIDataWrapper *)0x0 && (*(long *)(that[1].actualLocale + 0x88) != 0))
          && (UVar2 = RBBIDataWrapper::operator==
                                (*(RBBIDataWrapper **)(that[1].actualLocale + 0x88),this->fData),
             UVar2 != '\0')))) {
        this_local._7_1_ = '\x01';
      }
      else {
        this_local._7_1_ = '\0';
      }
      return this_local._7_1_;
    }
    return '\0';
  }
  return '\0';
}

Assistant:

UBool
RuleBasedBreakIterator::operator==(const BreakIterator& that) const {
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    if (this == &that) {
        return TRUE;
    }

    // The base class BreakIterator carries no state that participates in equality,
    // and does not implement an equality function that would otherwise be
    // checked at this point.

    const RuleBasedBreakIterator& that2 = (const RuleBasedBreakIterator&) that;

    if (!utext_equals(&fText, &that2.fText)) {
        // The two break iterators are operating on different text,
        //   or have a different iteration position.
        //   Note that fText's position is always the same as the break iterator's position.
        return FALSE;
    };

    if (!(fPosition == that2.fPosition &&
            fRuleStatusIndex == that2.fRuleStatusIndex &&
            fDone == that2.fDone)) {
        return FALSE;
    }

    if (that2.fData == fData ||
        (fData != NULL && that2.fData != NULL && *that2.fData == *fData)) {
            // The two break iterators are using the same rules.
            return TRUE;
        }
    return FALSE;
}